

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O3

double ON_SubDSectorType::CopyEdgeSectorCoefficient
                 (ON_SubDEdge *edge,ON_SubDVertex *vertex,double error_return_value)

{
  bool bVar1;
  double *pdVar2;
  long lVar3;
  
  if (vertex != (ON_SubDVertex *)0x0 && edge != (ON_SubDEdge *)0x0) {
    if (edge->m_vertex[0] == vertex) {
      lVar3 = 0;
    }
    else {
      if (edge->m_vertex[1] != vertex) {
        return error_return_value;
      }
      lVar3 = 1;
    }
    bVar1 = ON_SubDEdge::IsSmooth(edge);
    if (bVar1) {
      bVar1 = ON_SubDVertex::IsDartOrCreaseOrCorner(vertex);
      if ((!bVar1) && (bVar1 = ON_SubDVertex::IsSmooth(vertex), !bVar1)) {
        return error_return_value;
      }
      pdVar2 = edge->m_sector_coefficient + lVar3;
    }
    else {
      bVar1 = ON_SubDEdge::IsCrease(edge);
      if (!bVar1) {
        return error_return_value;
      }
      pdVar2 = &IgnoredSectorCoefficient;
    }
    error_return_value = *pdVar2;
  }
  return error_return_value;
}

Assistant:

double ON_SubDSectorType::CopyEdgeSectorCoefficient(
  const class ON_SubDEdge* edge,
  const class ON_SubDVertex* vertex,
  double error_return_value
)
{
  if ( nullptr != edge  && nullptr != vertex )
  {
    const int evi = (vertex == edge->m_vertex[0]) ? 0 : (vertex == edge->m_vertex[1] ? 1 : 2);
    if (evi < 2)
    {
      if (edge->IsSmooth())
      {
        if ( vertex->IsDartOrCreaseOrCorner() )
          return edge->m_sector_coefficient[evi];
        if ( vertex->IsSmooth() )
          return edge->m_sector_coefficient[evi];
      }
      else if ( edge->IsCrease() )
      {
        return ON_SubDSectorType::IgnoredSectorCoefficient;
      }
    }
  }

  // null pointers, unset tags, vertex and edge are not attached, 
  // or other conditions where returning a m_sector_coefficient[] 
  // is impossible or makes no sense.
  return error_return_value;
}